

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildNameCommand.cxx
# Opt level: O2

bool __thiscall
cmBuildNameCommand::InitialPass
          (cmBuildNameCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *name;
  string *psVar1;
  cmMakefile *this_00;
  bool bVar2;
  char *pcVar3;
  string *this_01;
  string buildname;
  string RegExp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string compiler;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_01 = &buildname;
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (name == psVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&compiler,"called with incorrect number of arguments",
               (allocator<char> *)&buildname);
    cmCommand::SetError(&this->super_cmCommand,&compiler);
    this_01 = &compiler;
  }
  else {
    pcVar3 = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,name);
    if (pcVar3 != (char *)0x0) {
      cmsys::RegularExpression::RegularExpression((RegularExpression *)&compiler,"[()/]");
      bVar2 = cmsys::RegularExpression::find((RegularExpression *)&compiler,pcVar3);
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&buildname,pcVar3,(allocator<char> *)&RegExp);
        RegExp._M_dataplus._M_p._0_1_ = 0x2f;
        local_180._M_dataplus._M_p._0_1_ = 0x5f;
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )buildname._M_dataplus._M_p,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(buildname._M_dataplus._M_p + buildname._M_string_length),(char *)&RegExp,
                   (char *)&local_180);
        RegExp._M_dataplus._M_p._0_1_ = 0x28;
        local_180._M_dataplus._M_p._0_1_ = 0x5f;
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )buildname._M_dataplus._M_p,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(buildname._M_dataplus._M_p + buildname._M_string_length),(char *)&RegExp,
                   (char *)&local_180);
        RegExp._M_dataplus._M_p._0_1_ = 0x29;
        local_180._M_dataplus._M_p._0_1_ = 0x5f;
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )buildname._M_dataplus._M_p,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(buildname._M_dataplus._M_p + buildname._M_string_length),(char *)&RegExp,
                   (char *)&local_180);
        cmMakefile::AddCacheDefinition
                  ((this->super_cmCommand).Makefile,
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,buildname._M_dataplus._M_p,
                   "Name of build.",STRING,false);
        std::__cxx11::string::~string((string *)&buildname);
      }
      cmsys::RegularExpression::~RegularExpression((RegularExpression *)&compiler);
      goto LAB_00237b44;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&buildname,"WinNT",(allocator<char> *)&compiler);
    this_00 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&compiler,"UNIX",(allocator<char> *)&RegExp);
    pcVar3 = cmMakefile::GetDefinition(this_00,&compiler);
    std::__cxx11::string::~string((string *)&compiler);
    if (pcVar3 != (char *)0x0) {
      buildname._M_string_length = 0;
      *buildname._M_dataplus._M_p = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&compiler,"uname -a",(allocator<char> *)&RegExp);
      cmSystemTools::RunSingleCommand
                (&compiler,&buildname,&buildname,(int *)0x0,(char *)0x0,OUTPUT_MERGE,(cmDuration)0x0
                );
      std::__cxx11::string::~string((string *)&compiler);
      if (buildname._M_string_length != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&RegExp,"([^ ]*) [^ ]* ([^ ]*) ",(allocator<char> *)&compiler);
        cmsys::RegularExpression::RegularExpression((RegularExpression *)&compiler,&RegExp);
        bVar2 = cmsys::RegularExpression::find
                          ((RegularExpression *)&compiler,buildname._M_dataplus._M_p);
        if (bVar2) {
          cmsys::RegularExpressionMatch::match_abi_cxx11_
                    (&local_70,(RegularExpressionMatch *)&compiler,1);
          std::operator+(&local_50,&local_70,"-");
          cmsys::RegularExpressionMatch::match_abi_cxx11_
                    (&local_90,(RegularExpressionMatch *)&compiler,2);
          std::operator+(&local_180,&local_50,&local_90);
          std::__cxx11::string::operator=((string *)&buildname,(string *)&local_180);
          std::__cxx11::string::~string((string *)&local_180);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
        }
        cmsys::RegularExpression::~RegularExpression((RegularExpression *)&compiler);
        std::__cxx11::string::~string((string *)&RegExp);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&compiler,"${CMAKE_CXX_COMPILER}",(allocator<char> *)&RegExp);
    cmMakefile::ExpandVariablesInString((this->super_cmCommand).Makefile,&compiler);
    std::__cxx11::string::append((char *)&buildname);
    cmsys::SystemTools::GetFilenameName(&RegExp,&compiler);
    std::__cxx11::string::append((string *)&buildname);
    std::__cxx11::string::~string((string *)&RegExp);
    RegExp._M_dataplus._M_p._0_1_ = 0x2f;
    local_180._M_dataplus._M_p._0_1_ = 0x5f;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )buildname._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(buildname._M_dataplus._M_p + buildname._M_string_length),(char *)&RegExp,
               (char *)&local_180);
    RegExp._M_dataplus._M_p._0_1_ = 0x28;
    local_180._M_dataplus._M_p._0_1_ = 0x5f;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )buildname._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(buildname._M_dataplus._M_p + buildname._M_string_length),(char *)&RegExp,
               (char *)&local_180);
    RegExp._M_dataplus._M_p._0_1_ = 0x29;
    local_180._M_dataplus._M_p._0_1_ = 0x5f;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )buildname._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(buildname._M_dataplus._M_p + buildname._M_string_length),(char *)&RegExp,
               (char *)&local_180);
    cmMakefile::AddCacheDefinition
              ((this->super_cmCommand).Makefile,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,buildname._M_dataplus._M_p,
               "Name of build.",STRING,false);
    std::__cxx11::string::~string((string *)&compiler);
  }
  std::__cxx11::string::~string((string *)this_01);
LAB_00237b44:
  return name != psVar1;
}

Assistant:

bool cmBuildNameCommand::InitialPass(std::vector<std::string> const& args,
                                     cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  const char* cacheValue = this->Makefile->GetDefinition(args[0]);
  if (cacheValue) {
    // do we need to correct the value?
    cmsys::RegularExpression reg("[()/]");
    if (reg.find(cacheValue)) {
      std::string cv = cacheValue;
      std::replace(cv.begin(), cv.end(), '/', '_');
      std::replace(cv.begin(), cv.end(), '(', '_');
      std::replace(cv.begin(), cv.end(), ')', '_');
      this->Makefile->AddCacheDefinition(args[0], cv.c_str(), "Name of build.",
                                         cmStateEnums::STRING);
    }
    return true;
  }

  std::string buildname = "WinNT";
  if (this->Makefile->GetDefinition("UNIX")) {
    buildname.clear();
    cmSystemTools::RunSingleCommand("uname -a", &buildname, &buildname);
    if (!buildname.empty()) {
      std::string RegExp = "([^ ]*) [^ ]* ([^ ]*) ";
      cmsys::RegularExpression reg(RegExp);
      if (reg.find(buildname)) {
        buildname = reg.match(1) + "-" + reg.match(2);
      }
    }
  }
  std::string compiler = "${CMAKE_CXX_COMPILER}";
  this->Makefile->ExpandVariablesInString(compiler);
  buildname += "-";
  buildname += cmSystemTools::GetFilenameName(compiler);
  std::replace(buildname.begin(), buildname.end(), '/', '_');
  std::replace(buildname.begin(), buildname.end(), '(', '_');
  std::replace(buildname.begin(), buildname.end(), ')', '_');

  this->Makefile->AddCacheDefinition(args[0], buildname.c_str(),
                                     "Name of build.", cmStateEnums::STRING);
  return true;
}